

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

bool __thiscall QSocks5SocketEngine::connectInternal(QSocks5SocketEngine *this)

{
  QSocks5SocketEnginePrivate *this_00;
  QTcpSocket *pQVar1;
  long lVar2;
  QArrayData *pQVar3;
  char cVar4;
  bool bVar5;
  quint16 qVar6;
  SocketType SVar7;
  quint16 port;
  QHostAddress *in_RSI;
  QAbstractSocketEngine *this_01;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QString local_68;
  QString local_48;
  long local_28;
  
  this_01 = (QAbstractSocketEngine *)&local_68;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSocks5SocketEnginePrivate **)(this + 8);
  if (this_00->data == (QSocks5Data *)0x0) {
    SVar7 = QAbstractSocketEngine::socketType((QAbstractSocketEngine *)this);
    if (SVar7 == TcpSocket) {
      QSocks5SocketEnginePrivate::initialize(this_00,ConnectMode);
      goto LAB_0023a099;
    }
    SVar7 = QAbstractSocketEngine::socketType((QAbstractSocketEngine *)this);
    if (SVar7 != UdpSocket) {
      connectInternal((QSocks5SocketEngine *)&local_68);
      lVar2 = *(long *)(this_01 + 8);
      QAbstractSocketEngine::setPeerAddress(this_01,in_RSI);
      QAbstractSocketEngine::setPeerPort(this_01,port);
      if (*(long *)(lVar2 + 0x120) != 0) {
        pQVar3 = *(QArrayData **)(lVar2 + 0x118);
        *(undefined8 *)(lVar2 + 0x118) = 0;
        *(undefined8 *)(lVar2 + 0x120) = 0;
        *(undefined8 *)(lVar2 + 0x128) = 0;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,2,0x10);
          }
        }
      }
      bVar5 = connectInternal((QSocks5SocketEngine *)this_01);
      return bVar5;
    }
    QSocks5SocketEnginePrivate::initialize(this_00,UdpAssociateMode);
    QVar8.m_data = (storage_type *)0x7;
    QVar8.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar8);
    local_48.d.d = local_68.d.d;
    local_48.d.ptr = local_68.d.ptr;
    local_48.d.size = local_68.d.size;
    QHostAddress::QHostAddress((QHostAddress *)&local_68,&local_48);
    cVar4 = (**(code **)(*(long *)this + 0x90))(this,&local_68,0);
    QHostAddress::~QHostAddress((QHostAddress *)&local_68);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (cVar4 != '\0') {
      QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,ConnectedState);
      bVar5 = true;
      goto LAB_0023a207;
    }
  }
  else {
LAB_0023a099:
    if ((this_00->super_QAbstractSocketEnginePrivate).socketState != ConnectingState) {
      if ((this_00->socks5State & ~AuthenticatingError) == Uninitialized) {
        QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,ConnectingState);
        pQVar1 = this_00->data->controlSocket;
        (**(code **)(*(long *)&pQVar1->super_QAbstractSocket + 0x108))(pQVar1,0x10000);
      }
      pQVar1 = this_00->data->controlSocket;
      QNetworkProxy::hostName(&local_68,&this_00->proxyInfo);
      qVar6 = QNetworkProxy::port(&this_00->proxyInfo);
      (**(code **)(*(long *)&pQVar1->super_QAbstractSocket + 0xf8))(pQVar1,&local_68,qVar6,3,2);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  bVar5 = false;
LAB_0023a207:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::connectInternal()
{
    Q_D(QSocks5SocketEngine);

    if (!d->data) {
        if (socketType() == QAbstractSocket::TcpSocket) {
            d->initialize(QSocks5SocketEnginePrivate::ConnectMode);
#ifndef QT_NO_UDPSOCKET
        } else if (socketType() == QAbstractSocket::UdpSocket) {
            d->initialize(QSocks5SocketEnginePrivate::UdpAssociateMode);
            // all udp needs to be bound
            if (!bind(QHostAddress("0.0.0.0"_L1), 0))
                return false;

            setState(QAbstractSocket::ConnectedState);
            return true;
#endif
        } else {
            qFatal("QSocks5SocketEngine::connectToHost: in QTcpServer mode");
            return false;
        }
    }

    if (d->socketState != QAbstractSocket::ConnectingState) {
        if (d->socks5State == QSocks5SocketEnginePrivate::Uninitialized
            // We may have new auth credentials since an earlier failure:
         || d->socks5State == QSocks5SocketEnginePrivate::AuthenticatingError) {
            setState(QAbstractSocket::ConnectingState);
            //limit buffer in internal socket, data is buffered in the external socket under application control
            d->data->controlSocket->setReadBufferSize(65536);
        }

        d->data->controlSocket->connectToHost(d->proxyInfo.hostName(), d->proxyInfo.port());
    }

    return false;
}